

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O1

void mcpl_internal_normalise_eol(mcpl_buffer_t *bufobj)

{
  undefined1 *puVar1;
  char *pcVar2;
  void *pvVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  long lVar8;
  size_t local_50;
  
  pcVar2 = bufobj->buf;
  pcVar4 = pcVar2 + bufobj->size;
  lVar6 = 0;
  do {
    if (pcVar2 == pcVar4) break;
    puVar1 = (undefined1 *)memchr(pcVar2,0xd,(long)pcVar4 - (long)pcVar2);
    if (puVar1 != (undefined1 *)0x0) {
      pcVar2 = puVar1 + 1;
      if ((pcVar2 == pcVar4) || (*pcVar2 != '\n')) {
        *puVar1 = 10;
      }
      else {
        lVar6 = lVar6 + 1;
        pcVar2 = puVar1 + 2;
      }
    }
  } while (puVar1 != (undefined1 *)0x0);
  if (lVar6 == 0) {
    return;
  }
  local_50 = bufobj->size - lVar6;
  if (local_50 == 0) {
    local_50 = 0;
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = mcpl_internal_malloc(local_50);
  }
  pcVar4 = bufobj->buf;
  pcVar5 = pcVar4 + bufobj->size;
  lVar8 = 0;
  pcVar7 = pcVar2;
  do {
    if (pcVar4 == pcVar5) break;
    pvVar3 = memchr(pcVar4,0xd,(long)pcVar5 - (long)pcVar4);
    if (pvVar3 == (void *)0x0) {
      memcpy(pcVar7,pcVar4,(long)pcVar5 - (long)pcVar4);
    }
    else {
      memcpy(pcVar7,pcVar4,((long)pvVar3 - (long)pcVar4) + 1);
      if ((((char *)((long)pvVar3 + 1) == pcVar5) || (*(char *)((long)pvVar3 + 1) != '\n')) ||
         (pcVar7 = pcVar7 + ((long)pvVar3 - (long)pcVar4), *pcVar7 != '\r')) {
        pcVar2 = " mcpl_internal_normalise_eol logic error (1)";
        goto LAB_00106bb7;
      }
      lVar8 = lVar8 + 1;
      *pcVar7 = '\n';
      pcVar7 = pcVar7 + 1;
      pcVar4 = (char *)((long)pvVar3 + 2);
    }
  } while (pvVar3 != (void *)0x0);
  if (lVar8 == lVar6) {
    pcVar4 = bufobj->buf;
    bufobj->buf = pcVar2;
    bufobj->size = local_50;
    bufobj->capacity = local_50;
    free(pcVar4);
    return;
  }
  pcVar2 = " mcpl_internal_normalise_eol logic error (2)";
LAB_00106bb7:
  (*mcpl_error_handler)(pcVar2);
  printf("MCPL ERROR: %s\n",
         "Handler given to mcpl_set_error_handler returns to calling code which is not allowed!");
  exit(1);
}

Assistant:

MCPL_LOCAL void mcpl_internal_normalise_eol( mcpl_buffer_t* bufobj )
{
  //Replace \r\n with \n and \r with \n.

  //First replace all \r not followed by \n inplace. Noting down if we saw any
  //\r\n along the way:
  size_t count_rn = 0;
  {
    char * buf = bufobj->buf;
    char * bufE = buf + bufobj->size;
    while( buf != bufE ) {
      char * hit = (char*)memchr( buf, '\r', bufE - buf );
      if (!hit)
        break;//done
      buf = hit + 1;
      if ( buf == bufE || *buf != '\n' ) {
        *hit = '\n';// \r but not \r\n so just with \n
      } else {
        //must be \r\n
        ++count_rn;
        ++buf;//skip over the \n
      }
    }
  }

  if (!count_rn)
    return;//done, we were able to fix everything inplace

  //Next replace \r\n with \n, requiring us to copy everything except any \r
  //chars to a new buffer:
  {
    size_t count_rn_replaced = 0;
    mcpl_buffer_t out = mcpl_internal_buf_create( bufobj->size - count_rn );
    char * dest = out.buf;
    {
      const char * buf = bufobj->buf;
      const char * bufE = buf + bufobj->size;
      while ( buf != bufE ) {
        char * hit = (char*)memchr( buf, '\r', bufE-buf );
        if (!hit) {
          //no more hits, just copy the rest:
          memcpy(dest,buf,bufE-buf);
          break;
        }
        ++count_rn_replaced;
        size_t ncopym1 = hit-buf;
        size_t ncopy = ncopym1+1;
        memcpy(dest,buf,ncopy);
        dest += ncopym1;
        buf += ncopy;
        if (buf==bufE || *buf != '\n' || *dest!='\r' )
          mcpl_error(" mcpl_internal_normalise_eol logic error (1)");
        *dest = '\n';
        ++dest;
        ++buf;//skip original '\n'
      }
      out.size = out.capacity;
      if ( count_rn_replaced != count_rn )
        mcpl_error(" mcpl_internal_normalise_eol logic error (2)");
      mcpl_internal_buf_swap(&out,bufobj);
      free(out.buf);
    }
  }
}